

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# depfile_parser_test.cc
# Opt level: O2

void __thiscall
DepfileParserTestContinuation::~DepfileParserTestContinuation(DepfileParserTestContinuation *this)

{
  DepfileParserTest::~DepfileParserTest(&this->super_DepfileParserTest);
  operator_delete(this,0x68);
  return;
}

Assistant:

TEST_F(DepfileParserTest, Continuation) {
  string err;
  EXPECT_TRUE(Parse(
"foo.o: \\\n"
"  bar.h baz.h\n",
      &err));
  ASSERT_EQ("", err);
  ASSERT_EQ(1u, parser_.outs_.size());
  EXPECT_EQ("foo.o", parser_.outs_[0].AsString());
  EXPECT_EQ(2u, parser_.ins_.size());
}